

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

PolynomialType * __thiscall
OpenMD::Polynomial<double>::operator*=(Polynomial<double> *this,double v)

{
  _Base_ptr p_Var1;
  double local_28;
  
  for (p_Var1 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    local_28 = (double)p_Var1[1]._M_parent * v;
    setCoefficient(this,p_Var1[1]._M_color,&local_28);
  }
  return this;
}

Assistant:

PolynomialType& operator*=(const Real v) {
      typename Polynomial<Real>::const_iterator i;
      // Polynomial<Real> result;

      for (i = this->begin(); i != this->end(); ++i) {
        this->setCoefficient(i->first, i->second * v);
      }

      return *this;
    }